

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

uint32 __thiscall
Clasp::Solver::simplifyConflictClause(Solver *this,LitVec *cc,ConstraintInfo *info,ClauseHead *rhs)

{
  bool bVar1;
  size_type sVar2;
  uint32 uVar3;
  reference pLVar4;
  iterator pLVar5;
  uint *puVar6;
  iterator this_00;
  iterator __p;
  iterator ppVar7;
  DecisionHeuristic *pDVar8;
  Solver *in_RCX;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_RSI;
  long in_RDI;
  ConstraintInfo *unaff_retaddr;
  LitVec *in_stack_00000008;
  Solver *in_stack_00000010;
  size_type stop_1;
  size_type x_1;
  iterator end_2;
  iterator it_2;
  weight_t newLbd;
  iterator j;
  uint32 repMode;
  const_iterator end_1;
  const_iterator it_1;
  BoolPair r;
  const_iterator end;
  const_iterator it;
  uint32 open;
  Antecedent ante;
  uint32 maxN;
  size_type stop;
  size_type x;
  uint32 jl;
  uint32 onAssert;
  undefined4 in_stack_ffffffffffffff08;
  Var in_stack_ffffffffffffff0c;
  Solver *in_stack_ffffffffffffff10;
  uint uVar9;
  uint in_stack_ffffffffffffff28;
  size_type in_stack_ffffffffffffff2c;
  Solver *in_stack_ffffffffffffff30;
  undefined2 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3a;
  undefined1 in_stack_ffffffffffffff3b;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  size_type n;
  undefined8 in_stack_ffffffffffffff50;
  uint32 pos;
  LitVec *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  ClauseHead *in_stack_ffffffffffffff68;
  pair<Clasp::Literal,_int> *ppVar10;
  undefined4 in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  uint in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined2 in_stack_ffffffffffffff84;
  pair<bool,_bool> in_stack_ffffffffffffff86;
  Literal *local_70;
  bool local_64;
  bool local_63;
  pair<bool,_bool> local_62;
  iterator local_60;
  iterator local_58;
  size_type local_4c;
  uint32 local_48;
  uint32 local_44;
  Antecedent local_40;
  uint local_34;
  size_type local_30;
  size_type local_2c;
  uint32 local_28;
  uint32 local_24;
  Solver *local_20;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *local_10;
  long lVar11;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  lVar11 = in_RDI;
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::clear
            ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 0x1a0));
  local_24 = ccMinimize((Solver *)
                        CONCAT26(in_stack_ffffffffffffff86,
                                 CONCAT24(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)),
                        (LitVec *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                        (LitVec *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        (uint32)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                        (CCMinRecursive *)
                        CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  sVar2 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size(local_10);
  if (sVar2 < 2) {
    uVar3 = 0;
  }
  else {
    pLVar4 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                       (local_10,1);
    Literal::var(pLVar4);
    uVar3 = level(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  }
  local_2c = 0;
  local_28 = uVar3;
  local_30 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size
                       ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                        (in_RDI + 0x1a0));
  for (; pos = (uint32)((ulong)in_stack_ffffffffffffff50 >> 0x20), local_2c != local_30;
      local_2c = local_2c + 1) {
    pLVar4 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                       ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                        (in_RDI + 0x1a0),local_2c);
    Literal::var(pLVar4);
    clearSeen(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  }
  if ((local_24 == 1) && ((*(ulong *)(in_RDI + 0x70) >> 0x23 & 3) != 0)) {
    local_34 = (uint)((ulong)*(undefined8 *)(in_RDI + 0x70) >> 0x23) & 3;
    if (local_34 < 3) {
      if (1 < local_34) {
        sVar2 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size(local_10);
        local_34 = sVar2 >> 1;
      }
    }
    else {
      local_34 = 0xffffffff;
    }
    pLVar4 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                       (local_10,0);
    Literal::var(pLVar4);
    markSeen(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    pLVar4 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                       (local_10,1);
    local_44 = pLVar4->rep_;
    local_40 = ccHasReverseArc((Solver *)
                               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                               (Literal)(uint32)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                               (uint32)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                               (uint32)in_stack_ffffffffffffff58);
    bVar1 = Antecedent::isNull(&local_40);
    if (!bVar1) {
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::clear
                ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 0x180));
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[](local_10,1);
      local_48 = (uint32)Literal::operator~((Literal *)
                                            CONCAT44(in_stack_ffffffffffffff0c,
                                                     in_stack_ffffffffffffff08));
      Antecedent::reason((Antecedent *)
                         CONCAT44(uVar3,CONCAT13(in_stack_ffffffffffffff3b,
                                                 CONCAT12(in_stack_ffffffffffffff3a,
                                                          in_stack_ffffffffffffff38))),
                         in_stack_ffffffffffffff30,(Literal)(uint32)((ulong)in_RDI >> 0x20),
                         (LitVec *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      ccResolve((Solver *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                in_stack_ffffffffffffff58,pos,
                (LitVec *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    }
    pLVar4 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                       (local_10,0);
    Literal::var(pLVar4);
    clearSeen(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  }
  uVar3 = (uint32)((ulong)lVar11 >> 0x20);
  if (local_20 != (Solver *)0x0) {
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::clear
              ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 0x180));
    (**(code **)(*(long *)local_20 + 0xa0))();
    local_4c = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size(local_10);
    pLVar4 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                       (local_10,0);
    Literal::var(pLVar4);
    markSeen(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    local_58 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::begin
                         ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                          (in_RDI + 0x180));
    local_60 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end
                         ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                          (in_RDI + 0x180));
    for (; local_58 != local_60 && local_4c != 0; local_58 = local_58 + 1) {
      Literal::var(local_58);
      uVar3 = level(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      bVar1 = false;
      if (uVar3 != 0) {
        Literal::var(local_58);
        bVar1 = seen(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      }
      local_4c = local_4c - bVar1;
    }
    if (local_4c == 0) {
      in_stack_ffffffffffffff30 =
           (Solver *)
           otfsRemove((Solver *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff68,
                      (LitVec *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    }
    else {
      in_stack_ffffffffffffff30 = (Solver *)0x0;
    }
    uVar3 = (uint32)((ulong)lVar11 >> 0x20);
    local_20 = in_stack_ffffffffffffff30;
    if (in_stack_ffffffffffffff30 != (Solver *)0x0) {
      local_63 = true;
      local_64 = false;
      std::pair<bool,_bool>::pair<bool,_bool,_true>(&local_62,&local_63,&local_64);
      in_stack_ffffffffffffff2c =
           bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size
                     ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 400))
      ;
      sVar2 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size
                        ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                         (in_RDI + 0x180));
      uVar3 = (uint32)((ulong)lVar11 >> 0x20);
      if (in_stack_ffffffffffffff2c < sVar2) {
        local_70 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::begin
                             ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                              (in_RDI + 0x180));
        pLVar5 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::end
                           ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                            (in_RDI + 0x180));
        while( true ) {
          uVar3 = (uint32)((ulong)lVar11 >> 0x20);
          uVar9 = in_stack_ffffffffffffff28 & 0xffffff;
          if (local_70 != pLVar5) {
            uVar9 = CONCAT13(local_62.first,(int3)in_stack_ffffffffffffff28);
          }
          in_stack_ffffffffffffff28 = uVar9;
          if ((in_stack_ffffffffffffff28 & 0x1000000) == 0) break;
          Literal::var(local_70);
          bVar1 = seen(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
          if (bVar1) {
            Literal::var(local_70);
            uVar3 = level(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
            if (uVar3 == 0) goto LAB_001edbcd;
          }
          else {
LAB_001edbcd:
            (**(code **)(*(long *)local_20 + 0xb0))(local_20,in_RDI,local_70->rep_,0);
            std::pair<bool,_bool>::operator=(&local_62,(type)&stack0xffffffffffffff86);
          }
          local_70 = local_70 + 1;
        }
        if ((local_62.first & 1U) == 0) {
          local_20 = (Solver *)0x0;
        }
      }
    }
    pLVar4 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                       (local_10,0);
    Literal::var(pLVar4);
    clearSeen(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  }
  sVar2 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size(local_10);
  decisionLevel((Solver *)0x1edc8f);
  puVar6 = std::max<unsigned_int>((uint *)&stack0xffffffffffffff78,(uint *)&stack0xffffffffffffff74)
  ;
  if (sVar2 < *puVar6) {
    uVar9 = 0;
  }
  else {
    uVar9 = (uint)((ulong)*(undefined8 *)(in_RDI + 0x70) >> 0x2b) & 3;
  }
  local_28 = finalizeConflictClause(in_stack_00000010,in_stack_00000008,unaff_retaddr,uVar3);
  bVar1 = bk_lib::
          pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
          ::empty((pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                   *)(in_RDI + 0x1b0));
  if (!bVar1) {
    this_00 = bk_lib::
              pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
              ::begin((pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                       *)(in_RDI + 0x1b0));
    uVar3 = ConstraintScore::lbd((ConstraintScore *)in_stack_ffffffffffffff10);
    __p = bk_lib::
          pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
          ::begin((pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                   *)(in_RDI + 0x1b0));
    ppVar7 = bk_lib::
             pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
             ::end((pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
                    *)(in_RDI + 0x1b0));
    for (; __p != ppVar7; __p = __p + 1) {
      ppVar10 = this_00;
      if (__p->second < (int)uVar3) {
        __p->second = (__p->second < 3) + 1;
        ppVar10 = this_00 + 1;
        std::pair<Clasp::Literal,_int>::operator=(this_00,__p);
      }
      this_00 = ppVar10;
    }
    in_stack_ffffffffffffff10 = (Solver *)(in_RDI + 0x1b0);
    bk_lib::
    pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
    end((pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
         *)(in_RDI + 0x1b0));
    bk_lib::
    pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
    erase((pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
           *)in_stack_ffffffffffffff30,
          (iterator)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
          (iterator)CONCAT44(sVar2,uVar9));
    pDVar8 = SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject>::operator->
                       ((SingleOwnerPtr<Clasp::DecisionHeuristic,_Clasp::DeleteObject> *)0x1ede12);
    (*pDVar8->_vptr_DecisionHeuristic[0xb])(0x3ff0000000000000,pDVar8,in_RDI,in_RDI + 0x1b0);
  }
  bk_lib::
  pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
  clear((pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
         *)(in_RDI + 0x1b0));
  n = 0;
  sVar2 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size
                    ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 0x1a0)
                    );
  for (; n != sVar2; n = n + 1) {
    pLVar4 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                       ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                        (in_RDI + 0x1a0),n);
    Literal::var(pLVar4);
    level(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    unmarkLevel(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  }
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::clear
            ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)(in_RDI + 0x1a0));
  return local_28;
}

Assistant:

uint32 Solver::simplifyConflictClause(LitVec& cc, ConstraintInfo& info, ClauseHead* rhs) {
	// 1. remove redundant literals from conflict clause
	temp_.clear();
	uint32 onAssert = ccMinimize(cc, temp_, strategy_.ccMinAntes, ccMin_);
	uint32 jl       = cc.size() > 1 ? level(cc[1].var()) : 0;
	// clear seen flags of removed literals - keep levels marked
	for (LitVec::size_type x = 0, stop = temp_.size(); x != stop; ++x) {
		clearSeen(temp_[x].var());
	}
	// 2. check for inverse arcs
	if (onAssert == 1 && strategy_.reverseArcs > 0) {
		uint32 maxN = (uint32)strategy_.reverseArcs;
		if      (maxN > 2) maxN = UINT32_MAX;
		else if (maxN > 1) maxN = static_cast<uint32>(cc.size() / 2);
		markSeen(cc[0].var());
		Antecedent ante = ccHasReverseArc(cc[1], jl, maxN);
		if (!ante.isNull()) {
			// resolve with inverse arc
			conflict_.clear();
			ante.reason(*this, ~cc[1], conflict_);
			ccResolve(cc, 1, conflict_);
		}
		clearSeen(cc[0].var());
	}
	// 3. check if final clause subsumes rhs
	if (rhs) {
		conflict_.clear();
		rhs->toLits(conflict_);
		uint32 open   = (uint32)cc.size();
		markSeen(cc[0].var());
		for (LitVec::const_iterator it = conflict_.begin(), end = conflict_.end(); it != end && open; ++it) {
			// NOTE: at this point the DB might not be fully simplified,
			//       e.g. because of mt or lookahead, hence we must explicitly
			//       check for literals assigned on DL 0
			open -= level(it->var()) > 0 && seen(it->var());
		}
		rhs = open ? 0 : otfsRemove(rhs, &cc);
		if (rhs) { // rhs is subsumed by cc but could not be removed.
			// TODO: we could reuse rhs instead of learning cc
			//       but this would complicate the calling code.
			ClauseHead::BoolPair r(true, false);
			if (cc_.size() < conflict_.size()) {
				//     For now, we only try to strengthen rhs.
				for (LitVec::const_iterator it = conflict_.begin(), end = conflict_.end(); it != end && r.first; ++it) {
					if (!seen(it->var()) || level(it->var()) == 0) {
						r = rhs->strengthen(*this, *it, false);
					}
				}
				if (!r.first) { rhs = 0; }
			}
		}
		clearSeen(cc[0].var());
	}
	// 4. finalize
	uint32 repMode = cc.size() < std::max(strategy_.compress, decisionLevel()+1) ? 0 : strategy_.ccRepMode;
	jl = finalizeConflictClause(cc, info, repMode);
	// 5. bump vars implied by learnt constraints with small lbd
	if (!bumpAct_.empty()) {
		WeightLitVec::iterator j = bumpAct_.begin();
		weight_t newLbd = info.lbd();
		for (WeightLitVec::iterator it = bumpAct_.begin(), end = bumpAct_.end(); it != end; ++it) {
			if (it->second < newLbd) {
				it->second = 1 + (it->second <= 2);
				*j++ = *it;
			}
		}
		bumpAct_.erase(j, bumpAct_.end());
		heuristic_->bump(*this, bumpAct_, 1.0);
	}
	bumpAct_.clear();
	// 6. clear level flags of redundant literals
	for (LitVec::size_type x = 0, stop = temp_.size(); x != stop; ++x) {
		unmarkLevel(level(temp_[x].var()));
	}
	temp_.clear();
	return jl;
}